

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

int stbtt_FindGlyphIndex(stbtt_fontinfo *info,int unicode_codepoint)

{
  uchar *puVar1;
  stbtt_uint32 sVar2;
  stbtt_uint32 sVar3;
  stbtt_uint32 sVar4;
  stbtt_uint32 sVar5;
  long lVar6;
  ushort uVar7;
  ulong uVar8;
  uint uVar9;
  ushort uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ushort uVar16;
  int iVar17;
  stbtt_uint8 *p;
  bool bVar18;
  
  puVar1 = info->data;
  uVar11 = info->index_map;
  uVar8 = (ulong)uVar11;
  uVar7 = *(ushort *)(puVar1 + uVar8) << 8;
  uVar10 = *(ushort *)(puVar1 + uVar8) >> 8;
  uVar16 = uVar7 | uVar10;
  uVar9 = 0;
  uVar13 = 0;
  switch(uVar16) {
  case 0:
    uVar13 = uVar9;
    if (unicode_codepoint <
        (int)((ushort)(*(ushort *)(puVar1 + uVar8 + 2) << 8 | *(ushort *)(puVar1 + uVar8 + 2) >> 8)
             - 6)) {
      uVar13 = (uint)puVar1[(long)unicode_codepoint + uVar8 + 6];
    }
    break;
  default:
    uVar13 = uVar9;
    if ((uVar7 | uVar10 & 0xfffe) == 0xc) {
      sVar3 = ttULONG(puVar1 + uVar8 + 0xc);
      iVar17 = 0;
      while (sVar2 = sVar3, sVar2 - iVar17 != 0 && iVar17 <= (int)sVar2) {
        sVar3 = ((int)(sVar2 - iVar17) >> 1) + iVar17;
        p = puVar1 + (long)(int)(sVar3 * 0xc) + uVar8 + 0x10;
        sVar4 = ttULONG(p);
        if (sVar4 <= (uint)unicode_codepoint) {
          sVar5 = ttULONG(p + 4);
          if ((uint)unicode_codepoint <= sVar5) {
            sVar3 = ttULONG(p + 8);
            iVar17 = 0;
            if (uVar16 == 0xc) {
              iVar17 = unicode_codepoint - sVar4;
            }
            return iVar17 + sVar3;
          }
          iVar17 = sVar3 + 1;
          sVar3 = sVar2;
        }
      }
      uVar13 = 0;
    }
    break;
  case 2:
    break;
  case 4:
    uVar13 = uVar9;
    if (unicode_codepoint < 0x10000) {
      uVar7 = *(ushort *)(puVar1 + uVar8 + 6) << 8 | *(ushort *)(puVar1 + uVar8 + 6) >> 8;
      uVar10 = *(ushort *)(puVar1 + uVar8 + 10) << 8 | *(ushort *)(puVar1 + uVar8 + 10) >> 8;
      uVar13 = (uint)(ushort)(*(ushort *)(puVar1 + uVar8 + 8) << 8 |
                             *(ushort *)(puVar1 + uVar8 + 8) >> 8);
      uVar15 = (ulong)(puVar1[uVar8 + 0xd] & 0xfffffffe) | (ulong)puVar1[uVar8 + 0xc] << 8;
      if (unicode_codepoint <
          (int)(uint)(ushort)(*(ushort *)(puVar1 + uVar15 + (uVar11 + 0xe)) << 8 |
                             *(ushort *)(puVar1 + uVar15 + (uVar11 + 0xe)) >> 8)) {
        uVar15 = 0;
      }
      uVar9 = uVar11 + (int)uVar15 + 0xc;
      while (bVar18 = uVar10 != 0, uVar10 = uVar10 - 1, bVar18) {
        uVar13 = uVar13 >> 1;
        uVar14 = uVar13 & 0xfffffffe;
        if (unicode_codepoint <=
            (int)(uint)(ushort)(*(ushort *)(puVar1 + (ulong)uVar14 + (ulong)uVar9) << 8 |
                               *(ushort *)(puVar1 + (ulong)uVar14 + (ulong)uVar9) >> 8)) {
          uVar14 = 0;
        }
        uVar9 = uVar14 + uVar9;
      }
      uVar15 = (ulong)((uVar9 - uVar11) + 0x1fff4 & 0x1fffe);
      uVar11 = 0;
      uVar13 = (uint)(ushort)(*(ushort *)(puVar1 + uVar15 + (uVar7 & 0xfffffffe) + uVar8 + 0x10) <<
                              8 | *(ushort *)(puVar1 + uVar15 + (uVar7 & 0xfffffffe) + uVar8 + 0x10)
                                  >> 8);
      if ((int)uVar13 <= unicode_codepoint) {
        uVar12 = (ulong)(uVar7 >> 1);
        lVar6 = uVar12 * 6;
        uVar7 = *(ushort *)(puVar1 + uVar15 + 2 + lVar6 + uVar8 + 0xe) << 8 |
                *(ushort *)(puVar1 + uVar15 + 2 + lVar6 + uVar8 + 0xe) >> 8;
        if (uVar7 == 0) {
          uVar11 = (uint)(ushort)(*(ushort *)(puVar1 + uVar15 + 2 + uVar12 * 4 + uVar8 + 0xe) << 8 |
                                 *(ushort *)(puVar1 + uVar15 + 2 + uVar12 * 4 + uVar8 + 0xe) >> 8) +
                   unicode_codepoint;
        }
        else {
          uVar11 = (uint)(ushort)(*(ushort *)
                                   (puVar1 + uVar15 + 0x10 +
                                             uVar8 + lVar6 +
                                             (long)(int)((unicode_codepoint - uVar13) * 2) +
                                             (ulong)uVar7) << 8 |
                                 *(ushort *)
                                  (puVar1 + uVar15 + 0x10 +
                                            uVar8 + lVar6 +
                                            (long)(int)((unicode_codepoint - uVar13) * 2) +
                                            (ulong)uVar7) >> 8);
        }
      }
      uVar13 = uVar11 & 0xffff;
    }
    break;
  case 6:
    uVar7 = *(ushort *)(puVar1 + uVar8 + 6) << 8 | *(ushort *)(puVar1 + uVar8 + 6) >> 8;
    uVar13 = uVar9;
    if (((uint)uVar7 <= (uint)unicode_codepoint) &&
       ((uint)unicode_codepoint <
        (uint)(ushort)(*(ushort *)(puVar1 + uVar8 + 8) << 8 | *(ushort *)(puVar1 + uVar8 + 8) >> 8)
        + (uint)uVar7)) {
      uVar13 = (uint)(ushort)(*(ushort *)
                               (puVar1 + (ulong)((unicode_codepoint - (uint)uVar7) * 2) + uVar8 + 10
                               ) << 8 |
                             *(ushort *)
                              (puVar1 + (ulong)((unicode_codepoint - (uint)uVar7) * 2) + uVar8 + 10)
                             >> 8);
    }
  }
  return uVar13;
}

Assistant:

STBTT_DEF int stbtt_FindGlyphIndex(const stbtt_fontinfo *info, int unicode_codepoint)
{
   stbtt_uint8 *data = info->data;
   stbtt_uint32 index_map = info->index_map;

   stbtt_uint16 format = ttUSHORT(data + index_map + 0);
   if (format == 0) { // apple byte encoding
      stbtt_int32 bytes = ttUSHORT(data + index_map + 2);
      if (unicode_codepoint < bytes-6)
         return ttBYTE(data + index_map + 6 + unicode_codepoint);
      return 0;
   } else if (format == 6) {
      stbtt_uint32 first = ttUSHORT(data + index_map + 6);
      stbtt_uint32 count = ttUSHORT(data + index_map + 8);
      if ((stbtt_uint32) unicode_codepoint >= first && (stbtt_uint32) unicode_codepoint < first+count)
         return ttUSHORT(data + index_map + 10 + (unicode_codepoint - first)*2);
      return 0;
   } else if (format == 2) {
      STBTT_assert(0); // @TODO: high-byte mapping for japanese/chinese/korean
      return 0;
   } else if (format == 4) { // standard mapping for windows fonts: binary search collection of ranges
      stbtt_uint16 segcount = ttUSHORT(data+index_map+6) >> 1;
      stbtt_uint16 searchRange = ttUSHORT(data+index_map+8) >> 1;
      stbtt_uint16 entrySelector = ttUSHORT(data+index_map+10);
      stbtt_uint16 rangeShift = ttUSHORT(data+index_map+12) >> 1;

      // do a binary search of the segments
      stbtt_uint32 endCount = index_map + 14;
      stbtt_uint32 search = endCount;

      if (unicode_codepoint > 0xffff)
         return 0;

      // they lie from endCount .. endCount + segCount
      // but searchRange is the nearest power of two, so...
      if (unicode_codepoint >= ttUSHORT(data + search + rangeShift*2))
         search += rangeShift*2;

      // now decrement to bias correctly to find smallest
      search -= 2;
      while (entrySelector) {
         stbtt_uint16 end;
         searchRange >>= 1;
         end = ttUSHORT(data + search + searchRange*2);
         if (unicode_codepoint > end)
            search += searchRange*2;
         --entrySelector;
      }
      search += 2;

      {
         stbtt_uint16 offset, start;
         stbtt_uint16 item = (stbtt_uint16) ((search - endCount) >> 1);

         STBTT_assert(unicode_codepoint <= ttUSHORT(data + endCount + 2*item));
         start = ttUSHORT(data + index_map + 14 + segcount*2 + 2 + 2*item);
         if (unicode_codepoint < start)
            return 0;

         offset = ttUSHORT(data + index_map + 14 + segcount*6 + 2 + 2*item);
         if (offset == 0)
            return (stbtt_uint16) (unicode_codepoint + ttSHORT(data + index_map + 14 + segcount*4 + 2 + 2*item));

         return ttUSHORT(data + offset + (unicode_codepoint-start)*2 + index_map + 14 + segcount*6 + 2 + 2*item);
      }
   } else if (format == 12 || format == 13) {
      stbtt_uint32 ngroups = ttULONG(data+index_map+12);
      stbtt_int32 low,high;
      low = 0; high = (stbtt_int32)ngroups;
      // Binary search the right group.
      while (low < high) {
         stbtt_int32 mid = low + ((high-low) >> 1); // rounds down, so low <= mid < high
         stbtt_uint32 start_char = ttULONG(data+index_map+16+mid*12);
         stbtt_uint32 end_char = ttULONG(data+index_map+16+mid*12+4);
         if ((stbtt_uint32) unicode_codepoint < start_char)
            high = mid;
         else if ((stbtt_uint32) unicode_codepoint > end_char)
            low = mid+1;
         else {
            stbtt_uint32 start_glyph = ttULONG(data+index_map+16+mid*12+8);
            if (format == 12)
               return start_glyph + unicode_codepoint-start_char;
            else // format == 13
               return start_glyph;
         }
      }
      return 0; // not found
   }
   // @TODO
   STBTT_assert(0);
   return 0;
}